

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ip4.cpp
# Opt level: O2

void __thiscall clickhouse::ColumnIPv4::Append(ColumnIPv4 *this,string *str)

{
  in_addr_t iVar1;
  runtime_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  iVar1 = inet_addr((str->_M_dataplus)._M_p);
  if (iVar1 != 0xffffffff) {
    local_38._M_dataplus._M_p._0_4_ =
         iVar1 >> 0x18 | (iVar1 & 0xff0000) >> 8 | (iVar1 & 0xff00) << 8 | iVar1 << 0x18;
    ColumnVector<unsigned_int>::Append
              ((this->data_).
               super___shared_ptr<clickhouse::ColumnVector<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr,(uint *)&local_38);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_38,"invalid IPv4 format, ip: ",str);
  std::runtime_error::runtime_error(this_00,(string *)&local_38);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void ColumnIPv4::Append(const std::string& str) {
    in_addr_t addr = inet_addr(str.c_str());
    if (addr == INADDR_NONE) {
        throw std::runtime_error("invalid IPv4 format, ip: " + str);
    }
    data_->Append(htonl(addr));
}